

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  bool _aborting;
  GroupInfo local_c0;
  TestGroupStats local_90;
  
  pIVar1 = (this->m_reporter).m_p;
  std::__cxx11::string::string((string *)&local_c0,(string *)testSpec);
  local_c0.groupIndex = groupIndex;
  local_c0.groupsCounts = groupsCount;
  _aborting = aborting(this);
  TestGroupStats::TestGroupStats(&local_90,&local_c0,totals,_aborting);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1,&local_90);
  TestGroupNode::~TestGroupNode((TestGroupNode *)&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }